

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O3

void __thiscall Fl_Widget::tooltip(Fl_Widget *this,char *text)

{
  byte *pbVar1;
  
  if (Fl_Tooltip::set_enter_exit_once_()::beenhere == '\0') {
    Fl_Tooltip::set_enter_exit_once_()::beenhere = '\x01';
    Fl_Tooltip::enter = Fl_Tooltip::enter_;
    Fl_Tooltip::exit = Fl_Tooltip::exit_;
  }
  if ((this->flags_ & 0x20000) != 0) {
    if (this->tooltip_ == text) {
      return;
    }
    free(this->tooltip_);
    pbVar1 = (byte *)((long)&this->flags_ + 2);
    *pbVar1 = *pbVar1 & 0xfd;
  }
  this->tooltip_ = text;
  return;
}

Assistant:

void Fl_Widget::tooltip(const char *text) {
  Fl_Tooltip::set_enter_exit_once_();
  if (flags() & COPIED_TOOLTIP) {
    // reassigning a copied tooltip remains the same copied tooltip
    if (tooltip_ == text) return;
    free((void*)(tooltip_));            // free maintained copy
    clear_flag(COPIED_TOOLTIP);         // disable copy flag (WE don't make copies)
  }
  tooltip_ = text;
}